

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O3

void __thiscall QFbScreen::initializeCompositor(QFbScreen *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  QSize local_58;
  QImage local_50 [16];
  undefined8 local_40;
  code *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.wd.m_i = (*(int *)(this + 0x58) - *(int *)(this + 0x50)) + 1;
  local_58.ht.m_i = (*(int *)(this + 0x5c) - *(int *)(this + 0x54)) + 1;
  QImage::QImage(local_50,&local_58,*(Format *)(this + 100));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_38);
  uVar1 = local_40;
  local_38 = QStringView::split;
  local_40 = 0;
  local_28 = *(undefined1 **)(this + 0x88);
  *(undefined8 *)(this + 0x88) = uVar1;
  QImage::~QImage((QImage *)&local_38);
  QImage::~QImage(local_50);
  scheduleUpdate(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::initializeCompositor()
{
    mScreenImage = QImage(mGeometry.size(), mFormat);
    scheduleUpdate();
}